

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureSRGBDecodeCase::test
          (TextureSRGBDecodeCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *pTVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  ObjectTraits *traits;
  long *plVar7;
  size_type *psVar8;
  TesterType TVar9;
  ulong uVar10;
  undefined8 uVar11;
  ScopedLogSection section;
  GLint decodeInt;
  ScopedLogSection section_1;
  GLfloat decodeFloat;
  Texture texture;
  ScopedLogSection local_118;
  long local_110;
  TestLog local_108;
  long lStack_100;
  string local_f8;
  string local_d8;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  string local_98;
  GLuint local_74;
  ResultCollector *local_70;
  ScopedLogSection local_68;
  code *local_60;
  GLenum local_58;
  GLfloat local_4c;
  ObjectWrapper local_48;
  
  TVar9 = (this->super_TextureTest).m_tester;
  bVar3 = isPureIntTester(TVar9);
  bVar4 = true;
  if (!bVar3) {
    bVar4 = isPureUintTester(TVar9);
  }
  iVar5 = (*((this->super_TextureTest).m_renderCtx)->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper(&local_48,(Functions *)CONCAT44(extraout_var,iVar5),traits);
  glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,local_48.m_object);
  GVar6 = glu::CallLogWrapper::glGetError(gl);
  local_70 = result;
  if (GVar6 != 0) {
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
    local_60 = glu::getErrorName;
    local_58 = GVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_60);
    uVar10 = 0xf;
    if (local_b8 != local_a8) {
      uVar10 = local_a8[0];
    }
    if (uVar10 < local_d8._M_string_length + local_b0) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        uVar11 = local_d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_d8._M_string_length + local_b0) goto LAB_007de053;
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8)
      ;
    }
    else {
LAB_007de053:
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_b8,(ulong)local_d8._M_dataplus._M_p);
    }
    local_118.m_log = &local_108;
    pTVar2 = (TestLog *)(plVar7 + 2);
    if ((TestLog *)*plVar7 == pTVar2) {
      local_108.m_log = pTVar2->m_log;
      lStack_100 = plVar7[3];
    }
    else {
      local_108.m_log = pTVar2->m_log;
      local_118.m_log = (TestLog *)*plVar7;
    }
    local_110 = plVar7[1];
    *plVar7 = (long)pTVar2;
    plVar7[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_f8.field_2._M_allocated_capacity = *psVar8;
      local_f8.field_2._8_8_ = plVar7[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar8;
      local_f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98.field_2._8_8_ = plVar7[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_98._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(local_70,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    result = local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_118.m_log != &local_108) {
      operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
  }
  if (bVar4 == false) {
    pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    paVar1 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Initial","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Initial","");
    tcu::ScopedLogSection::ScopedLogSection(&local_118,pTVar2,&local_98,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
    tcu::TestLog::endSection(local_118.m_log);
    pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Toggle","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Toggle","");
    tcu::ScopedLogSection::ScopedLogSection(&local_68,pTVar2,&local_98,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_74 = 0x8a49;
    local_4c = 35401.0;
    glu::CallLogWrapper::glTexParameteri
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a);
    GVar6 = glu::CallLogWrapper::glGetError(gl);
    if (GVar6 != 0) {
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
      local_60 = glu::getErrorName;
      local_58 = GVar6;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_60);
      uVar10 = 0xf;
      if (local_b8 != local_a8) {
        uVar10 = local_a8[0];
      }
      if (uVar10 < local_d8._M_string_length + local_b0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar11 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_d8._M_string_length + local_b0) goto LAB_007de438;
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
      }
      else {
LAB_007de438:
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_b8,(ulong)local_d8._M_dataplus._M_p);
      }
      local_118.m_log = &local_108;
      pTVar2 = (TestLog *)(plVar7 + 2);
      if ((TestLog *)*plVar7 == pTVar2) {
        local_108.m_log = pTVar2->m_log;
        lStack_100 = plVar7[3];
      }
      else {
        local_108.m_log = pTVar2->m_log;
        local_118.m_log = (TestLog *)*plVar7;
      }
      local_110 = plVar7[1];
      *plVar7 = (long)pTVar2;
      plVar7[1] = 0;
      *(undefined1 *)&pTVar2->m_log = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_f8.field_2._M_allocated_capacity = *psVar8;
        local_f8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar8;
        local_f8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_f8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98.field_2._8_8_ = plVar7[3];
        local_98._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_98._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::ResultCollector::fail(result,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_118.m_log != &local_108) {
        operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameteriv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_74);
    GVar6 = glu::CallLogWrapper::glGetError(gl);
    if (GVar6 != 0) {
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
      local_60 = glu::getErrorName;
      local_58 = GVar6;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_60);
      uVar10 = 0xf;
      if (local_b8 != local_a8) {
        uVar10 = local_a8[0];
      }
      if (uVar10 < local_d8._M_string_length + local_b0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar11 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_d8._M_string_length + local_b0) goto LAB_007de6ae;
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
      }
      else {
LAB_007de6ae:
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_b8,(ulong)local_d8._M_dataplus._M_p);
      }
      local_118.m_log = &local_108;
      pTVar2 = (TestLog *)(plVar7 + 2);
      if ((TestLog *)*plVar7 == pTVar2) {
        local_108.m_log = pTVar2->m_log;
        lStack_100 = plVar7[3];
      }
      else {
        local_108.m_log = pTVar2->m_log;
        local_118.m_log = (TestLog *)*plVar7;
      }
      local_110 = plVar7[1];
      *plVar7 = (long)pTVar2;
      plVar7[1] = 0;
      *(undefined1 *)&pTVar2->m_log = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_f8.field_2._M_allocated_capacity = *psVar8;
        local_f8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar8;
        local_f8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_f8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98.field_2._8_8_ = plVar7[3];
        local_98._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_98._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::ResultCollector::fail(result,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_118.m_log != &local_108) {
        operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterf
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,35402.0);
    GVar6 = glu::CallLogWrapper::glGetError(gl);
    if (GVar6 != 0) {
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
      local_60 = glu::getErrorName;
      local_58 = GVar6;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_60);
      uVar10 = 0xf;
      if (local_b8 != local_a8) {
        uVar10 = local_a8[0];
      }
      if (uVar10 < local_d8._M_string_length + local_b0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar11 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_d8._M_string_length + local_b0) goto LAB_007de924;
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
      }
      else {
LAB_007de924:
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_b8,(ulong)local_d8._M_dataplus._M_p);
      }
      local_118.m_log = &local_108;
      pTVar2 = (TestLog *)(plVar7 + 2);
      if ((TestLog *)*plVar7 == pTVar2) {
        local_108.m_log = pTVar2->m_log;
        lStack_100 = plVar7[3];
      }
      else {
        local_108.m_log = pTVar2->m_log;
        local_118.m_log = (TestLog *)*plVar7;
      }
      local_110 = plVar7[1];
      *plVar7 = (long)pTVar2;
      plVar7[1] = 0;
      *(undefined1 *)&pTVar2->m_log = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_f8.field_2._M_allocated_capacity = *psVar8;
        local_f8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar8;
        local_f8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_f8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98.field_2._8_8_ = plVar7[3];
        local_98._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_98._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::ResultCollector::fail(result,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_118.m_log != &local_108) {
        operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterfv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_4c);
    GVar6 = glu::CallLogWrapper::glGetError(gl);
    if (GVar6 != 0) {
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
      local_60 = glu::getErrorName;
      local_58 = GVar6;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_60);
      uVar10 = 0xf;
      if (local_b8 != local_a8) {
        uVar10 = local_a8[0];
      }
      if (uVar10 < local_d8._M_string_length + local_b0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar11 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_d8._M_string_length + local_b0) goto LAB_007deb9a;
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
      }
      else {
LAB_007deb9a:
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_b8,(ulong)local_d8._M_dataplus._M_p);
      }
      local_118.m_log = &local_108;
      pTVar2 = (TestLog *)(plVar7 + 2);
      if ((TestLog *)*plVar7 == pTVar2) {
        local_108.m_log = pTVar2->m_log;
        lStack_100 = plVar7[3];
      }
      else {
        local_108.m_log = pTVar2->m_log;
        local_118.m_log = (TestLog *)*plVar7;
      }
      local_110 = plVar7[1];
      *plVar7 = (long)pTVar2;
      plVar7[1] = 0;
      *(undefined1 *)&pTVar2->m_log = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_f8.field_2._M_allocated_capacity = *psVar8;
        local_f8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar8;
        local_f8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_f8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98.field_2._8_8_ = plVar7[3];
        local_98._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_98._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::ResultCollector::fail(result,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_118.m_log != &local_108) {
        operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
    tcu::TestLog::endSection((TestLog *)CONCAT44(local_68.m_log._4_4_,local_68.m_log._0_4_));
  }
  TVar9 = (this->super_TextureTest).m_tester;
  bVar3 = isPureIntTester(TVar9);
  if (bVar3) {
    local_68.m_log._0_4_ = 0x8a4a;
    local_74 = 0x8a49;
    glu::CallLogWrapper::glTexParameterIiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_68);
    GVar6 = glu::CallLogWrapper::glGetError(gl);
    if (GVar6 != 0) {
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
      local_60 = glu::getErrorName;
      local_58 = GVar6;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_60);
      uVar10 = 0xf;
      if (local_b8 != local_a8) {
        uVar10 = local_a8[0];
      }
      if (uVar10 < local_d8._M_string_length + local_b0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar11 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_d8._M_string_length + local_b0) goto LAB_007dee44;
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
      }
      else {
LAB_007dee44:
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_b8,(ulong)local_d8._M_dataplus._M_p);
      }
      local_118.m_log = &local_108;
      pTVar2 = (TestLog *)(plVar7 + 2);
      if ((TestLog *)*plVar7 == pTVar2) {
        local_108.m_log = pTVar2->m_log;
        lStack_100 = plVar7[3];
      }
      else {
        local_108.m_log = pTVar2->m_log;
        local_118.m_log = (TestLog *)*plVar7;
      }
      local_110 = plVar7[1];
      *plVar7 = (long)pTVar2;
      plVar7[1] = 0;
      *(undefined1 *)&pTVar2->m_log = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_f8.field_2._M_allocated_capacity = *psVar8;
        local_f8.field_2._8_8_ = plVar7[3];
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar8;
        local_f8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_f8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98.field_2._8_8_ = plVar7[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_98._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::ResultCollector::fail(local_70,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      result = local_70;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_118.m_log != &local_108) {
        operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterIiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_74);
    GVar6 = glu::CallLogWrapper::glGetError(gl);
    if (GVar6 != 0) {
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
      local_60 = glu::getErrorName;
      local_58 = GVar6;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_60);
      uVar10 = 0xf;
      if (local_b8 != local_a8) {
        uVar10 = local_a8[0];
      }
      if (uVar10 < local_d8._M_string_length + local_b0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar11 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_d8._M_string_length + local_b0) goto LAB_007df0c6;
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
      }
      else {
LAB_007df0c6:
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_b8,(ulong)local_d8._M_dataplus._M_p);
      }
      local_118.m_log = &local_108;
      pTVar2 = (TestLog *)(plVar7 + 2);
      if ((TestLog *)*plVar7 == pTVar2) {
        local_108.m_log = pTVar2->m_log;
        lStack_100 = plVar7[3];
      }
      else {
        local_108.m_log = pTVar2->m_log;
        local_118.m_log = (TestLog *)*plVar7;
      }
      local_110 = plVar7[1];
      *plVar7 = (long)pTVar2;
      plVar7[1] = 0;
      *(undefined1 *)&pTVar2->m_log = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_f8.field_2._M_allocated_capacity = *psVar8;
        local_f8.field_2._8_8_ = plVar7[3];
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar8;
        local_f8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_f8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98.field_2._8_8_ = plVar7[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_98._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::ResultCollector::fail(local_70,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      result = local_70;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_118.m_log != &local_108) {
        operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
    TVar9 = (this->super_TextureTest).m_tester;
  }
  bVar3 = isPureUintTester(TVar9);
  if (!bVar3) goto LAB_007df7c3;
  local_68.m_log._0_4_ = 0x8a4a;
  local_74 = 0x8a49;
  glu::CallLogWrapper::glTexParameterIuiv
            (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
             (GLuint *)&local_68);
  GVar6 = glu::CallLogWrapper::glGetError(gl);
  if (GVar6 != 0) {
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
    local_60 = glu::getErrorName;
    local_58 = GVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_60);
    uVar10 = 0xf;
    if (local_b8 != local_a8) {
      uVar10 = local_a8[0];
    }
    if (uVar10 < local_d8._M_string_length + local_b0) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        uVar11 = local_d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_d8._M_string_length + local_b0) goto LAB_007df36f;
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8)
      ;
    }
    else {
LAB_007df36f:
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_b8,(ulong)local_d8._M_dataplus._M_p);
    }
    local_118.m_log = &local_108;
    pTVar2 = (TestLog *)(plVar7 + 2);
    if ((TestLog *)*plVar7 == pTVar2) {
      local_108.m_log = pTVar2->m_log;
      lStack_100 = plVar7[3];
    }
    else {
      local_108.m_log = pTVar2->m_log;
      local_118.m_log = (TestLog *)*plVar7;
    }
    local_110 = plVar7[1];
    *plVar7 = (long)pTVar2;
    plVar7[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_f8.field_2._M_allocated_capacity = *psVar8;
      local_f8.field_2._8_8_ = plVar7[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar8;
      local_f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98.field_2._8_8_ = plVar7[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_98._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(local_70,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    result = local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_118.m_log != &local_108) {
      operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
  }
  StateQueryUtil::verifyStateTextureParamInteger
            (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a,
             (this->super_TextureTest).m_type);
  glu::CallLogWrapper::glTexParameterIuiv
            (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_74);
  GVar6 = glu::CallLogWrapper::glGetError(gl);
  if (GVar6 != 0) {
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
    local_60 = glu::getErrorName;
    local_58 = GVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_60);
    uVar10 = 0xf;
    if (local_b8 != local_a8) {
      uVar10 = local_a8[0];
    }
    if (uVar10 < local_d8._M_string_length + local_b0) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        uVar11 = local_d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_d8._M_string_length + local_b0) goto LAB_007df5f1;
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8)
      ;
    }
    else {
LAB_007df5f1:
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_b8,(ulong)local_d8._M_dataplus._M_p);
    }
    local_118.m_log = &local_108;
    pTVar2 = (TestLog *)(plVar7 + 2);
    if ((TestLog *)*plVar7 == pTVar2) {
      local_108.m_log = pTVar2->m_log;
      lStack_100 = plVar7[3];
    }
    else {
      local_108.m_log = pTVar2->m_log;
      local_118.m_log = (TestLog *)*plVar7;
    }
    local_110 = plVar7[1];
    *plVar7 = (long)pTVar2;
    plVar7[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_f8.field_2._M_allocated_capacity = *psVar8;
      local_f8.field_2._8_8_ = plVar7[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar8;
      local_f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98.field_2._8_8_ = plVar7[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_98._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(local_70,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    result = local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_118.m_log != &local_108) {
      operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
  }
  StateQueryUtil::verifyStateTextureParamInteger
            (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49,
             (this->super_TextureTest).m_type);
LAB_007df7c3:
  glu::ObjectWrapper::~ObjectWrapper(&local_48);
  return;
}

Assistant:

void TextureSRGBDecodeCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool		isPureCase	= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	glu::Texture	texture		(m_renderCtx);

	gl.glBindTexture(m_target, *texture);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind");

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (!isPureCase)
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Toggle", "Toggle");
		const glw::GLint			decodeInt		= GL_DECODE_EXT;
		const glw::GLfloat			decodeFloat		= (glw::GLfloat)GL_DECODE_EXT;

		gl.glTexParameteri(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameteriv(m_target, m_pname, &decodeInt);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);

		gl.glTexParameterf(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameterfv(m_target, m_pname, &decodeFloat);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureIntTester(m_tester))
	{
		const glw::GLint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLint decode		= GL_DECODE_EXT;

		gl.glTexParameterIiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameterIiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureUintTester(m_tester))
	{
		const glw::GLuint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLuint decode		= GL_DECODE_EXT;

		gl.glTexParameterIuiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameterIuiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}
}